

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O2

void handle_frame(cio_websocket *websocket,uint8_t *data,uint64_t length)

{
  cio_utf8_state *arg0;
  cio_timer *arg0_00;
  cio_response_buffer *wbh;
  size_t sVar1;
  cio_http_client *pcVar2;
  bool bVar3;
  uint8_t uVar4;
  uint16_t uVar5;
  cio_error err;
  char *reason;
  size_t sVar6;
  cio_websocket_status_code status_code;
  anon_struct_4_7_799a2f31_for_ws_flags aVar7;
  void *pvVar8;
  ulong reason_length;
  uint8_t *puVar9;
  uint_fast8_t uVar10;
  size_t len;
  _Bool _Var11;
  cio_utf8_state local_32;
  
  aVar7 = (websocket->ws_private).ws_flags;
  if (((uint)aVar7 >> 10 & 1) != 0) {
    cio_websocket_mask(data,length,(websocket->ws_private).received_mask);
    aVar7._2_2_ = 0;
    aVar7._0_2_ = *(ushort *)&(websocket->ws_private).ws_flags;
  }
  uVar10 = (uint_fast8_t)length;
  switch((uint)aVar7 >> 1 & 0xf) {
  case 1:
    arg0 = &(websocket->ws_private).utf8_state;
    uVar4 = cio_check_utf8(arg0,data,length);
    if ((uVar4 == '\f') || ((uVar4 != '\0' & aVar7._0_1_) != 0)) {
      reason = "payload not valid utf8";
      err = CIO_PROTOCOL_NOT_SUPPORTED;
      status_code = CIO_WEBSOCKET_CLOSE_UNSUPPORTED_DATA;
      goto LAB_0010c867;
    }
    sVar1 = (websocket->ws_private).remaining_read_frame_length;
    if (((uint)aVar7 & 1) != 0) {
      cio_utf8_init(arg0);
    }
    if (sVar1 != 0) {
      cio_websocket_correct_mask((websocket->ws_private).received_mask,length);
    }
    sVar6 = (websocket->ws_private).read_frame_length;
    pvVar8 = (websocket->ws_private).read_handler_context;
    _Var11 = false;
    goto LAB_0010c942;
  case 2:
    sVar1 = (websocket->ws_private).remaining_read_frame_length;
    if (sVar1 != 0) {
      cio_websocket_correct_mask((websocket->ws_private).received_mask,length);
    }
    sVar6 = (websocket->ws_private).read_frame_length;
    pvVar8 = (websocket->ws_private).read_handler_context;
    _Var11 = true;
LAB_0010c942:
    (*(websocket->ws_private).read_handler)
              (websocket,pvVar8,CIO_SUCCESS,sVar6,data,length,sVar1 == 0,(_Bool)(aVar7._0_1_ & 1),
               _Var11);
    return;
  default:
    reason = "reserved opcode used";
    break;
  case 8:
    reason_length = length & 0xff;
    bVar3 = true;
    if (uVar10 == '\0') {
      uVar5 = 1000;
LAB_0010ca91:
      if (websocket->on_control !=
          (_func_void_cio_websocket_ptr_cio_websocket_frame_type_uint8_t_ptr_uint_fast8_t *)0x0) {
        (*websocket->on_control)(websocket,CIO_WEBSOCKET_CLOSE_FRAME,data,uVar10);
      }
      if (((websocket->ws_private).ws_flags.field_0x1 & 2) == 0) {
        puVar9 = data + 2;
        if (bVar3) {
          puVar9 = (uint8_t *)0x0;
        }
        prepare_close_job(websocket,(uint)uVar5,puVar9,reason_length,
                          (cio_websocket_write_handler_t)0x0,(void *)0x0,
                          response_close_frame_written);
        enqueue_job(websocket,&(websocket->ws_private).write_close_job,
                    (((websocket->ws_private).write_close_job.wbh)->data).element.length);
        return;
      }
      arg0_00 = &(websocket->ws_private).close_timer;
      cio_timer_cancel(arg0_00);
      cio_timer_close(arg0_00);
      close((int)websocket);
      return;
    }
    if (((uint)length & 0xff) == 1) {
      reason = "close payload of length 1";
    }
    else {
      uVar5 = cio_be16toh(*(uint16_t *)data);
      if (((0xf82f < (ushort)(uVar5 + 0xec78)) || ((uVar5 & 0xfffc) == 1000)) ||
         (0xfffa < (ushort)(uVar5 - 0x3f4))) {
        if ((byte)(uVar10 - 2) == 0) {
          reason_length = 0;
        }
        else {
          reason_length = (ulong)(byte)(uVar10 - 2);
          cio_utf8_init(&local_32);
          uVar4 = cio_check_utf8(&local_32,data + 2,reason_length - 2);
          if (uVar4 != '\0') {
            handle_error(websocket,CIO_PROTOCOL_NOT_SUPPORTED,CIO_WEBSOCKET_CLOSE_UNSUPPORTED_DATA,
                         "reason in close frame not utf8 valid");
            return;
          }
          bVar3 = false;
        }
        goto LAB_0010ca91;
      }
      reason = "invalid status code in close";
    }
    break;
  case 9:
    wbh = &(websocket->ws_private).ping_buffer;
    (websocket->ws_private).ping_buffer.wb_head.prev = &wbh->wb_head;
    (websocket->ws_private).ping_buffer.wb_head.next = &wbh->wb_head;
    (websocket->ws_private).ping_buffer.wb_head.data.head.q_len = 0;
    (websocket->ws_private).ping_buffer.wb_head.data.element.length = 0;
    if (uVar10 != '\0') {
      puVar9 = (websocket->ws_private).ping_buffer.buffer;
      memcpy(puVar9,data,length & 0xff);
      (websocket->ws_private).ping_buffer.write_buffer.data.head.q_len = (size_t)puVar9;
      (websocket->ws_private).ping_buffer.write_buffer.data.element.length = length & 0xff;
      cio_write_buffer_queue_tail(&wbh->wb_head,&(websocket->ws_private).ping_buffer.write_buffer);
    }
    if (websocket->on_control !=
        (_func_void_cio_websocket_ptr_cio_websocket_frame_type_uint8_t_ptr_uint_fast8_t *)0x0) {
      (*websocket->on_control)(websocket,CIO_WEBSOCKET_PING_FRAME,data,uVar10);
    }
    (websocket->ws_private).write_pong_job.wbh = &wbh->wb_head;
    (websocket->ws_private).write_pong_job.handler = pong_frame_written;
    (websocket->ws_private).write_pong_job.handler_context = (void *)0x0;
    (websocket->ws_private).write_pong_job.frame_type = CIO_WEBSOCKET_PONG_FRAME;
    (websocket->ws_private).write_pong_job.last_frame = true;
    (websocket->ws_private).write_pong_job.stream_handler = message_written;
    enqueue_job(websocket,&(websocket->ws_private).write_pong_job,
                (websocket->ws_private).ping_buffer.wb_head.data.element.length);
    return;
  case 10:
    if (websocket->on_control !=
        (_func_void_cio_websocket_ptr_cio_websocket_frame_type_uint8_t_ptr_uint_fast8_t *)0x0) {
      (*websocket->on_control)(websocket,CIO_WEBSOCKET_PONG_FRAME,data,uVar10);
    }
    pcVar2 = (websocket->ws_private).http_client;
    err = cio_buffered_stream_read_at_least
                    (&pcVar2->buffered_stream,&pcVar2->rb,1,get_header,websocket);
    if (err == CIO_SUCCESS) {
      return;
    }
    reason = "could not restart receiving handling a pong frame received";
    status_code = CIO_WEBSOCKET_CLOSE_INTERNAL_ERROR;
    goto LAB_0010c867;
  }
  err = CIO_PROTOCOL_NOT_SUPPORTED;
  status_code = CIO_WEBSOCKET_CLOSE_PROTOCOL_ERROR;
LAB_0010c867:
  handle_error(websocket,err,status_code,reason);
  return;
}

Assistant:

static void handle_frame(struct cio_websocket *websocket, uint8_t *data, uint64_t length)
{
	if (websocket->ws_private.ws_flags.is_server == 1U) {
		cio_websocket_mask(data, (size_t)length, websocket->ws_private.received_mask);
	}

	uint_fast8_t opcode = (uint_fast8_t)websocket->ws_private.ws_flags.opcode;
	switch (opcode) {
	case CIO_WEBSOCKET_BINARY_FRAME:
		handle_binary_frame(websocket, data, length, websocket->ws_private.ws_flags.fin == 1U);
		break;

	case CIO_WEBSOCKET_TEXT_FRAME:
		handle_text_frame(websocket, data, length, websocket->ws_private.ws_flags.fin == 1U);
		break;

	case CIO_WEBSOCKET_PING_FRAME:
		handle_ping_frame(websocket, data, (uint_fast8_t)length);
		break;

	case CIO_WEBSOCKET_PONG_FRAME:
		handle_pong_frame(websocket, data, (uint_fast8_t)length);
		break;

	case CIO_WEBSOCKET_CLOSE_FRAME:
		handle_close_frame(websocket, data, (uint_fast8_t)length);
		break;

	default:
		handle_error(websocket, CIO_PROTOCOL_NOT_SUPPORTED, CIO_WEBSOCKET_CLOSE_PROTOCOL_ERROR, "reserved opcode used");
		break;
	}
}